

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

int __thiscall Client::do_recv(Client *this,int fd)

{
  char **ppcVar1;
  pointer pcVar2;
  int __status;
  FILE *__stream;
  undefined8 in_RAX;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  undefined8 uVar6;
  size_t sVar7;
  uint uVar8;
  bool bVar9;
  undefined4 uVar10;
  
  uVar10 = (undefined4)((ulong)in_RAX >> 0x20);
  if (this->_sock_fd == fd) {
    pcVar5 = (this->_sock2stdout)._r_pos;
    sVar7 = (long)this + (0x1058 - (long)pcVar5);
    if ((sVar7 == 0) ||
       ((bVar9 = fd == 0, bVar9 &&
        (&(this->_stdin2sock)._r_pos == (char **)(this->_stdin2sock)._r_pos)))) {
      pcVar5 = "%s(%d)-<%s>: sock_fd can read, but _sock2stdout have no empty space to read!\n";
      uVar6 = 0x86;
LAB_00101c79:
      fprintf(_stderr,pcVar5,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,uVar6,"do_recv");
      fflush(_stderr);
      return -6;
    }
    sVar3 = read(fd,pcVar5,sVar7);
    uVar8 = (uint)sVar3;
  }
  else {
    if (fd != 0) {
      fprintf(_stderr,"%s(%d)-<%s>: unknown fd: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0x9b,"do_recv",fd);
      fflush(_stderr);
      __status = -4;
      goto LAB_00101d5b;
    }
    pcVar5 = (this->_stdin2sock)._r_pos;
    sVar7 = (long)this + (0x848 - (long)pcVar5);
    if (sVar7 == 0) {
      pcVar5 = "%s(%d)-<%s>: stdin can read, buf _stdin2sock have no empty space to read!\n";
      uVar6 = 0x8a;
      goto LAB_00101c79;
    }
    sVar3 = read(0,pcVar5,sVar7);
    uVar8 = (uint)sVar3;
    bVar9 = true;
  }
  if ((int)uVar8 < 0) {
    piVar4 = __errno_location();
    __stream = _stderr;
    if (*piVar4 != 0xb) {
      pcVar5 = strerror(*piVar4);
      fprintf(__stream,"%s(%d)-<%s>: recv fd:%d occurs error, error %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0xa3,"do_recv",fd,pcVar5);
      fflush(_stderr);
      __status = -5;
      goto LAB_00101d5b;
    }
  }
  else {
    if (uVar8 != 0) {
      fprintf(_stderr,"%s(%d)-<%s>: read done from fd: %d, total nbytes: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0xc6,"do_recv",fd,CONCAT44(uVar10,uVar8));
      fflush(_stderr);
      if (this->_sock_fd == fd) {
        ppcVar1 = &(this->_sock2stdout)._r_pos;
        *ppcVar1 = *ppcVar1 + (uVar8 & 0x7fffffff);
        return 0;
      }
      if (!bVar9) {
        return 0;
      }
      ppcVar1 = &(this->_stdin2sock)._r_pos;
      *ppcVar1 = *ppcVar1 + (uVar8 & 0x7fffffff);
      return 0;
    }
    if (this->_sock_fd == fd) {
      fprintf(_stderr,"%s(%d)-<%s>: read EOF on sock\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0xac,"do_recv");
      fflush(_stderr);
      pcVar2 = (this->_svr_ip)._M_dataplus._M_p;
      if (this->_stdineof == true) {
        fprintf(_stderr,
                "%s(%d)-<%s>: EOF on sock after EOF on stdin, so disconnect to server[%s:%d]\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
                ,0xaf,"do_recv",pcVar2,CONCAT44(uVar10,this->_svr_port));
        fflush(_stderr);
        return -1;
      }
      fprintf(_stderr,"%s(%d)-<%s>: server[%s:%d] terminated prematurely\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0xb4,"do_recv",pcVar2,CONCAT44(uVar10,this->_svr_port));
      fflush(_stderr);
      __status = -2;
LAB_00101d5b:
      exit(__status);
    }
    if (bVar9) {
      fprintf(_stderr,"%s(%d)-<%s>: read EOF on stdin\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0xba,"do_recv");
      fflush(_stderr);
      this->_stdineof = true;
      if ((this->_stdin2sock)._r_pos != (this->_stdin2sock)._w_pos) {
        return 0;
      }
      fprintf(_stderr,
              "%s(%d)-<%s>: EOF on stdin and no data to send sock, so shutdown sock write side\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
              ,0xbe,"do_recv");
      fflush(_stderr);
      shutdown(this->_sock_fd,1);
      return -3;
    }
  }
  return 0;
}

Assistant:

int Client::do_recv(int fd)
{
    int nrecv;

    if ((fd == _sock_fd && _sock2stdout.left_size() == 0) ||
        (fd == STDIN_FILENO && _stdin2sock.left_size() == 0))
    {
        if (fd == _sock_fd)
        {
            LOG_PRINT("sock_fd can read, but _sock2stdout have no empty space to read!");
        }
        else if (fd == STDIN_FILENO)
        {
            LOG_PRINT("stdin can read, buf _stdin2sock have no empty space to read!")
        }

        return err_clt_recv_nospace;
    }


    if (fd == _sock_fd)
    {
        nrecv = read(_sock_fd, _sock2stdout._r_pos, _sock2stdout.left_size());
    }
    else if (fd == STDIN_FILENO)
    {
        nrecv = read(STDIN_FILENO, _stdin2sock._r_pos, _stdin2sock.left_size());
    }
    else
    {
        LOG_PRINT("unknown fd: %d", fd);
        exit(err_clt_recv_unknown_fd);
    }

    if (nrecv < 0)
    {
        if (errno != EAGAIN)    //也就是 EWOULDBLOCK
        {
            LOG_PRINT("recv fd:%d occurs error, error %s", fd, strerror(errno));
            exit(err_clt_recv_error);

        }
    }
    else if (nrecv == 0)
    {
        if (fd == _sock_fd)
        {
            LOG_PRINT("read EOF on sock");
            if (_stdineof)
            {
                LOG_PRINT("EOF on sock after EOF on stdin, so disconnect to server[%s:%d]", _svr_ip.c_str(), _svr_port);
                return err_clt_recv_disconn;
            }
            else 
            {
                LOG_PRINT("server[%s:%d] terminated prematurely", _svr_ip.c_str(), _svr_port);
                exit(err_clt_recv_svrcrash);
            }
        }
        else if (fd == STDIN_FILENO)
        {
            LOG_PRINT("read EOF on stdin");
            _stdineof = true;
            if (_stdin2sock.data_size() == 0)
            {
                LOG_PRINT("EOF on stdin and no data to send sock, so shutdown sock write side");
                shutdown(_sock_fd, SHUT_WR);
                return err_clt_recv_shutdown_wr;
            }
        }
    }
    else
    {
        LOG_PRINT("read done from fd: %d, total nbytes: %d", fd, nrecv);
        if (fd == _sock_fd)
        {
            _sock2stdout.set_r_pow(nrecv);
        }
        else if (fd == STDIN_FILENO)
        {
            _stdin2sock.set_r_pow(nrecv);
        }
        return err_clt_recv_normal;
    }
    return err_clt_recv_normal;
}